

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

int __thiscall ImFontAtlas::AddCustomRectRegular(ImFontAtlas *this,uint id,int width,int height)

{
  undefined1 local_40 [8];
  CustomRect r;
  int height_local;
  int width_local;
  uint id_local;
  ImFontAtlas *this_local;
  
  r.Font._4_4_ = height;
  if (id < 0x10000) {
    __assert_fail("id >= 0x10000",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                  ,0x64c,"int ImFontAtlas::AddCustomRectRegular(unsigned int, int, int)");
  }
  if (width < 1 || 0xffff < width) {
    __assert_fail("width > 0 && width <= 0xFFFF",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                  ,0x64d,"int ImFontAtlas::AddCustomRectRegular(unsigned int, int, int)");
  }
  if (height < 1 || 0xffff < height) {
    __assert_fail("height > 0 && height <= 0xFFFF",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                  ,0x64e,"int ImFontAtlas::AddCustomRectRegular(unsigned int, int, int)");
  }
  CustomRect::CustomRect((CustomRect *)local_40);
  local_40._4_2_ = (undefined2)width;
  local_40._6_2_ = (undefined2)r.Font._4_4_;
  local_40._0_4_ = id;
  ImVector<ImFontAtlas::CustomRect>::push_back(&this->CustomRects,(value_type *)local_40);
  return (this->CustomRects).Size + -1;
}

Assistant:

int ImFontAtlas::AddCustomRectRegular(unsigned int id, int width, int height)
{
    IM_ASSERT(id >= 0x10000);
    IM_ASSERT(width > 0 && width <= 0xFFFF);
    IM_ASSERT(height > 0 && height <= 0xFFFF);
    CustomRect r;
    r.ID = id;
    r.Width = (unsigned short)width;
    r.Height = (unsigned short)height;
    CustomRects.push_back(r);
    return CustomRects.Size - 1; // Return index
}